

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall CP::queue<int>::expand(queue<int> *this,size_t capacity)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  int *__s;
  size_t sVar4;
  ulong uVar5;
  
  uVar5 = -(ulong)(capacity >> 0x3e != 0) | capacity * 4;
  __s = (int *)operator_new__(uVar5);
  memset(__s,0,uVar5);
  piVar1 = this->mData;
  sVar2 = this->mSize;
  if (sVar2 == 0) {
    if (piVar1 == (int *)0x0) goto LAB_001016e6;
  }
  else {
    uVar5 = this->mCap;
    sVar3 = this->mFront;
    sVar4 = 0;
    do {
      __s[sVar4] = piVar1[(sVar3 + sVar4) % uVar5];
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  operator_delete__(piVar1);
LAB_001016e6:
  this->mData = __s;
  this->mCap = capacity;
  this->mFront = 0;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[(mFront + i) % mCap];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
      mFront = 0;
    }